

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

int IoCommandWrite(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char *__s;
  Abc_Ntk_t *pNtk;
  int iVar1;
  Io_FileType_t FileType;
  size_t sVar2;
  char *pcVar3;
  char Command [1000];
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if ((iVar1 != -1) || (globalUtilOptind + 1 != argc)) {
    fwrite("usage: write [-h] <file>\n",0x19,1,(FILE *)pAbc->Err);
    fwrite("\t         writes the current network into <file> by calling\n",0x3c,1,(FILE *)pAbc->Err
          );
    fwrite("\t         the writer that matches the extension of <file>\n",0x3a,1,(FILE *)pAbc->Err);
    fwrite("\t-h     : print the help massage\n",0x21,1,(FILE *)pAbc->Err);
    fwrite("\tfile   : the name of the file to write\n",0x28,1,(FILE *)pAbc->Err);
    return 1;
  }
  __s = argv[globalUtilOptind];
  Command[0] = '\0';
  sVar2 = strlen(__s);
  if (899 < sVar2) {
    __assert_fail("strlen(pFileName) < 900",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/io.c"
                  ,0x4e2,"int IoCommandWrite(Abc_Frame_t *, int, char **)");
  }
  pcVar3 = Extra_FileNameExtension(__s);
  iVar1 = strcmp(pcVar3,"genlib");
  if (iVar1 == 0) {
    pcVar3 = "write_genlib %s";
  }
  else {
    pcVar3 = Extra_FileNameExtension(__s);
    iVar1 = strcmp(pcVar3,"lib");
    if (iVar1 == 0) {
      pcVar3 = "write_liberty %s";
    }
    else {
      pcVar3 = Extra_FileNameExtension(__s);
      iVar1 = strcmp(pcVar3,"dsd");
      if (iVar1 != 0) goto LAB_0028c2e3;
      pcVar3 = "dsd_save %s";
    }
  }
  sprintf(Command,pcVar3,__s);
LAB_0028c2e3:
  if (Command[0] == '\0') {
    pNtk = pAbc->pNtkCur;
    if (pNtk == (Abc_Ntk_t *)0x0) {
      fwrite("Empty network.\n",0xf,1,(FILE *)pAbc->Out);
    }
    else {
      FileType = Io_ReadFileType(__s);
      Io_Write(pNtk,__s,FileType);
    }
  }
  else {
    Cmd_CommandExecute(pAbc,Command);
  }
  return 0;
}

Assistant:

int IoCommandWrite( Abc_Frame_t * pAbc, int argc, char **argv )
{
    char Command[1000];
    char * pFileName;
    int c;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the output file name
    pFileName = argv[globalUtilOptind];
    // write libraries
    Command[0] = 0;
    assert( strlen(pFileName) < 900 );
    if ( !strcmp( Extra_FileNameExtension(pFileName), "genlib" )  )
        sprintf( Command, "write_genlib %s", pFileName );
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "lib" ) )
        sprintf( Command, "write_liberty %s", pFileName );
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "dsd" ) )
        sprintf( Command, "dsd_save %s", pFileName );
    if ( Command[0] )
    {
        Cmd_CommandExecute( pAbc, Command );
        return 0;
    }
    if ( pAbc->pNtkCur == NULL )
    {
        fprintf( pAbc->Out, "Empty network.\n" );
        return 0;
    }
    // call the corresponding file writer
    Io_Write( pAbc->pNtkCur, pFileName, Io_ReadFileType(pFileName) );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: write [-h] <file>\n" );
    fprintf( pAbc->Err, "\t         writes the current network into <file> by calling\n" );
    fprintf( pAbc->Err, "\t         the writer that matches the extension of <file>\n" );
    fprintf( pAbc->Err, "\t-h     : print the help massage\n" );
    fprintf( pAbc->Err, "\tfile   : the name of the file to write\n" );
    return 1;
}